

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalyticSolution.cpp
# Opt level: O2

void __thiscall TLaplaceExample1::TLaplaceExample1(TLaplaceExample1 *this,TLaplaceExample1 *cp)

{
  TPZAnalyticSolution::TPZAnalyticSolution
            (&this->super_TPZAnalyticSolution,&cp->super_TPZAnalyticSolution);
  (this->super_TPZAnalyticSolution)._vptr_TPZAnalyticSolution =
       (_func_int **)&PTR__TLaplaceExample1_01816578;
  *(undefined4 *)&(this->super_TPZAnalyticSolution).field_0xc = 2;
  this->fExact = cp->fExact;
  TPZManVector<double,_3>::TPZManVector(&this->fCenter,0);
  TPZFNMatrix<9,_double>::TPZFNMatrix(&this->fTensorPerm);
  TPZFNMatrix<9,_double>::TPZFNMatrix(&this->fInvPerm);
  this->fmaxIter = 0xf;
  std::operator<<((ostream *)&std::cout,
                  "TLaplaceExample1::TLaplaceExample1(const TLaplaceExample1 &cp): One should not invoke this copy constructor"
                 );
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZAnalyticSolution.cpp"
             ,0x4dd);
}

Assistant:

TLaplaceExample1::TLaplaceExample1(const TLaplaceExample1 &cp) : TPZAnalyticSolution(cp),fExact(cp.fExact) {
    std::cout << "TLaplaceExample1::TLaplaceExample1(const TLaplaceExample1 &cp): One should not invoke this copy constructor";
    DebugStop();
}